

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Framebuffer.cpp
# Opt level: O1

Ptr<Framebuffer> __thiscall
myvk::Framebuffer::Create(Framebuffer *this,Ptr<RenderPass> *render_pass,Ptr<ImageView> *image_view)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  initializer_list<std::shared_ptr<myvk::ImageView>_> __l;
  Ptr<Framebuffer> PVar3;
  allocator_type local_49;
  shared_ptr<myvk::ImageView> local_48;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  local_38;
  VkExtent2D local_20;
  
  local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::vector(&local_38,__l,&local_49);
  peVar1 = (((image_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.width = (peVar1->m_extent).width;
  local_20.height = (peVar1->m_extent).height;
  Create(this,render_pass,&local_38,&local_20,1);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector(&local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Framebuffer>)PVar3.super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Framebuffer> Framebuffer::Create(const Ptr<RenderPass> &render_pass, const Ptr<ImageView> &image_view) {
	return Create(render_pass, {image_view}, image_view->GetImagePtr()->GetExtent2D(), 1);
}